

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall cfd::core::ExtPrivkey::ExtPrivkey(ExtPrivkey *this,ByteData *serialize_data)

{
  ByteData256 local_30;
  ByteData *local_18;
  ByteData *serialize_data_local;
  ExtPrivkey *this_local;
  
  local_18 = serialize_data;
  serialize_data_local = &this->serialize_data_;
  ByteData256::ByteData256(&local_30);
  ExtPrivkey(this,serialize_data,&local_30);
  ByteData256::~ByteData256((ByteData256 *)0x443ec9);
  return;
}

Assistant:

ExtPrivkey::ExtPrivkey(const ByteData& serialize_data)
    : ExtPrivkey(serialize_data, ByteData256()) {
  // do nothing
}